

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O1

void __thiscall Js::JavascriptSet::PromoteToSimpleVarSet(JavascriptSet *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  Type TVar5;
  long *plVar6;
  int iVar7;
  uint initialCapacity;
  
  if (this->kind != IntSet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x121,"(this->kind == SetKind::IntSet)",
                                "this->kind == SetKind::IntSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  plVar6 = *(long **)this->u;
  if (plVar6 == (long *)0x0) {
    initialCapacity = 1;
  }
  else {
    iVar7 = 0;
    do {
      BVar3 = BVUnitT<unsigned_long>::CountBit(plVar6[2]);
      iVar7 = iVar7 + BVar3;
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
    initialCapacity = iVar7 + 1;
  }
  TVar5 = (Type)CreateVarSetFromList<JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                          (this,initialCapacity);
  this->kind = SimpleVarSet;
  Memory::Recycler::WBSetBit((char *)&(this->u).simpleVarSet);
  this->u = TVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->u);
  return;
}

Assistant:

void
JavascriptSet::PromoteToSimpleVarSet()
{
    AssertOrFailFast(this->kind == SetKind::IntSet);
    SimpleVarDataSet* newSet = this->CreateVarSetFromList<SimpleVarDataSet>(this->u.intSet->Count() + 1);

    this->kind = SetKind::SimpleVarSet;
    this->u.simpleVarSet = newSet;
}